

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Scene::erase_selected_joint(Scene *this)

{
  SceneObject *pSVar1;
  Joint *this_00;
  
  pSVar1 = (this->selected).object;
  if (pSVar1 != (SceneObject *)0x0) {
    this_00 = (Joint *)__dynamic_cast(pSVar1,&SceneObject::typeinfo,&Joint::typeinfo,0);
    if (this_00 != (Joint *)0x0) {
      Joint::removeJoint(this_00,this);
      (this->selected).coordinates.x = 0.0;
      (this->selected).coordinates.y = 0.0;
      (this->selected).object = (SceneObject *)0x0;
      (this->selected).element = (HalfedgeElement *)0x0;
      (this->selected).coordinates.z = 0.0;
      (this->selected).axis = None;
    }
  }
  return;
}

Assistant:

void Scene::erase_selected_joint() {
  if (selected.object == nullptr) return;
  Joint *j = dynamic_cast<Joint *>(selected.object);
  if (j) {
    j->removeJoint(this);
    selected.clear();
  }
}